

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testInvalidBufferName(ErrorsTest *this)

{
  char cVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  undefined4 *puVar7;
  Enum<int,_2UL> EVar8;
  Enum<int,_2UL> local_6a8;
  MessageBuilder local_698;
  GetNameFunc local_518;
  int local_510;
  Enum<int,_2UL> local_508;
  MessageBuilder local_4f8;
  GetNameFunc local_378;
  int local_370;
  Enum<int,_2UL> local_368;
  MessageBuilder local_358;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8;
  MessageBuilder local_1b8;
  int local_38;
  GLenum error;
  GLuint local_24;
  GLuint local_20;
  GLuint query;
  GLuint invalid_buffer;
  bool is_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _invalid_buffer = CONCAT44(extraout_var,iVar2);
  query._3_1_ = 1;
  query._2_1_ = 0;
  local_20 = 0;
  do {
    local_20 = local_20 + 1;
    cVar1 = (**(code **)(_invalid_buffer + 0xc68))();
  } while (cVar1 != '\0');
  local_24 = 0;
  (**(code **)(_invalid_buffer + 0x3d8))(0x8914,1,&local_24);
  err = (**(code **)(_invalid_buffer + 0x800))();
  glu::checkError(err,"glCreateQueries have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x306);
  (*this->m_pGetQueryBufferObjectiv)(local_24,local_20,0x8867,0);
  local_38 = (**(code **)(_invalid_buffer + 0x800))();
  if (local_38 != 0x502) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [80])
                        "glGetQueryBufferObjectiv which could generate buffers overflow generated error "
                       );
    EVar8 = glu::getErrorStr(local_38);
    local_1d8 = EVar8.m_getName;
    local_1d0 = EVar8.m_value;
    local_1c8.m_getName = local_1d8;
    local_1c8.m_value = local_1d0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1c8);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectuiv)(local_24,local_20,0x8867,0);
  local_38 = (**(code **)(_invalid_buffer + 0x800))();
  if (local_38 != 0x502) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_358,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_358,
                        (char (*) [81])
                        "glGetQueryBufferObjectuiv which could generate buffers overflow generated error "
                       );
    EVar8 = glu::getErrorStr(local_38);
    local_378 = EVar8.m_getName;
    local_370 = EVar8.m_value;
    local_368.m_getName = local_378;
    local_368.m_value = local_370;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_368);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjecti64v)(local_24,local_20,0x8867,0);
  local_38 = (**(code **)(_invalid_buffer + 0x800))();
  if (local_38 != 0x502) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_4f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4f8,
                        (char (*) [82])
                        "glGetQueryBufferObjecti64v which could generate buffers overflow generated error "
                       );
    EVar8 = glu::getErrorStr(local_38);
    local_518 = EVar8.m_getName;
    local_510 = EVar8.m_value;
    local_508.m_getName = local_518;
    local_508.m_value = local_510;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_508);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4f8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectui64v)(local_24,local_20,0x8867,0);
  local_38 = (**(code **)(_invalid_buffer + 0x800))();
  if (local_38 != 0x502) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_698,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_698,
                        (char (*) [83])
                        "glGetQueryBufferObjectui64v which could generate buffers overflow generated error "
                       );
    EVar8 = glu::getErrorStr(local_38);
    local_6a8.m_getName = EVar8.m_getName;
    local_6a8.m_value = EVar8.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6a8);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_698);
    query._3_1_ = 0;
  }
  if (local_24 != 0) {
    (**(code **)(_invalid_buffer + 0x458))(1,&local_24);
  }
  do {
    iVar2 = (**(code **)(_invalid_buffer + 0x800))();
  } while (iVar2 != 0);
  if ((query._2_1_ & 1) == 0) {
    return (bool)(query._3_1_ & 1);
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::testInvalidBufferName()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default result. */
	bool is_ok	= true;
	bool is_error = false;

	/* Creating invalid buffer name. */
	glw::GLuint invalid_buffer = 0;

	while (gl.isBuffer(++invalid_buffer))
		;

	/* Test's objects. */
	glw::GLuint query = 0;

	try
	{
		/* Create query object for the test. */
		gl.createQueries(s_targets[0], 1, &query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		/* Test query of invalid buffer name (integer version). */
		m_pGetQueryBufferObjectiv(query, invalid_buffer, GL_QUERY_RESULT_AVAILABLE, 0);

		glw::GLenum error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectiv which could generate buffers overflow generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid buffer name (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(query, invalid_buffer, GL_QUERY_RESULT_AVAILABLE, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectuiv which could generate buffers overflow generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid buffer name (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(query, invalid_buffer, GL_QUERY_RESULT_AVAILABLE, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjecti64v which could generate buffers overflow generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid buffer name (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(query, invalid_buffer, GL_QUERY_RESULT_AVAILABLE, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectui64v which could generate buffers overflow generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_error = true;
	}

	/* Releasing objects. */
	if (query)
	{
		gl.deleteQueries(1, &query);
	}

	/* Error cleanup. */
	while (gl.getError())
		;

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}